

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cscope.c
# Opt level: O0

int csexists(char *cmd)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  int local_440;
  int dlen;
  int len;
  char *tmp;
  char *pathc;
  char *path;
  char *dir;
  char fname [1024];
  char *cmd_local;
  
  fname._1016_8_ = cmd;
  pcVar3 = strchr(cmd,0x2f);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = getenv("PATH");
    if (pcVar3 == (char *)0x0) {
      cmd_local._4_4_ = 0;
    }
    else {
      pcVar3 = strndup(pcVar3,0x400);
      pathc = pcVar3;
      if (pcVar3 == (char *)0x0) {
        cmd_local._4_4_ = dobeep_msg("out of memory");
      }
      else {
        do {
          do {
            path = strsep(&pathc,":");
            if (path == (char *)0x0) {
LAB_00127451:
              free(pcVar3);
              return 0;
            }
          } while (*path == '\0');
          sVar4 = strlen(path);
          local_440 = (int)sVar4;
          while( true ) {
            bVar5 = false;
            if (0 < local_440) {
              bVar5 = path[local_440 + -1] == '/';
            }
            if (!bVar5) break;
            local_440 = local_440 + -1;
            path[local_440] = '\0';
          }
          uVar2 = snprintf((char *)&dir,0x400,"%s/%s",path,fname._1016_8_);
          if (((int)uVar2 < 0) || (0x3ff < uVar2)) {
            dobeep_msg("path too long");
            goto LAB_00127451;
          }
          iVar1 = access((char *)&dir,0);
        } while (iVar1 != 0);
        free(pcVar3);
        cmd_local._4_4_ = 1;
      }
    }
  }
  else {
    iVar1 = access((char *)fname._1016_8_,0);
    if (iVar1 == -1) {
      cmd_local._4_4_ = 0;
    }
    else {
      cmd_local._4_4_ = 1;
    }
  }
  return cmd_local._4_4_;
}

Assistant:

int
csexists(const char *cmd)
{
	char fname[NFILEN], *dir, *path, *pathc, *tmp;
	int  len, dlen;

	/* Special case if prog contains '/' */
	if (strchr(cmd, '/')) {
		if (access(cmd, F_OK) == -1)
			return (FALSE);
		else
			return (TRUE);
	}
	if ((tmp = getenv("PATH")) == NULL)
		return (FALSE);
	if ((pathc = path = strndup(tmp, NFILEN)) == NULL)
		return(dobeep_msg("out of memory"));

	while ((dir = strsep(&path, ":")) != NULL) {
		if (*dir == '\0')
			continue;

		dlen = strlen(dir);
		while (dlen > 0 && dir[dlen-1] == '/')
			dir[--dlen] = '\0';     /* strip trailing '/' */

		len = snprintf(fname, sizeof(fname), "%s/%s", dir, cmd);
		if (len < 0 || len >= sizeof(fname)) {
			(void)dobeep_msg("path too long");
			goto cleanup;
		}
		if(access(fname, F_OK) == 0) {
			free(pathc);
			return (TRUE);
		}
	}
cleanup:
	free(pathc);
	return (FALSE);
}